

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_zip.c
# Opt level: O0

uchar * cd_alloc(zip_conflict *zip,size_t length)

{
  uchar *puVar1;
  void *__ptr;
  void *pvVar2;
  long in_RSI;
  long in_RDI;
  cd_segment *segment;
  uchar *p;
  
  if ((*(long *)(in_RDI + 0x68) == 0) ||
     ((ulong)(*(long *)(*(long *)(in_RDI + 0x70) + 0x10) + *(long *)(*(long *)(in_RDI + 0x70) + 8))
      < (ulong)(*(long *)(*(long *)(in_RDI + 0x70) + 0x18) + in_RSI))) {
    __ptr = calloc(1,0x20);
    if (__ptr == (void *)0x0) {
      return (uchar *)0x0;
    }
    *(undefined8 *)((long)__ptr + 8) = 0x10000;
    pvVar2 = malloc(*(size_t *)((long)__ptr + 8));
    *(void **)((long)__ptr + 0x10) = pvVar2;
    if (*(long *)((long)__ptr + 0x10) == 0) {
      free(__ptr);
      return (uchar *)0x0;
    }
    *(undefined8 *)((long)__ptr + 0x18) = *(undefined8 *)((long)__ptr + 0x10);
    if (*(long *)(in_RDI + 0x68) == 0) {
      *(void **)(in_RDI + 0x70) = __ptr;
      *(void **)(in_RDI + 0x68) = __ptr;
    }
    else {
      **(undefined8 **)(in_RDI + 0x70) = __ptr;
      *(void **)(in_RDI + 0x70) = __ptr;
    }
  }
  puVar1 = *(uchar **)(*(long *)(in_RDI + 0x70) + 0x18);
  *(long *)(*(long *)(in_RDI + 0x70) + 0x18) = in_RSI + *(long *)(*(long *)(in_RDI + 0x70) + 0x18);
  *(long *)(in_RDI + 0x78) = in_RSI + *(long *)(in_RDI + 0x78);
  return puVar1;
}

Assistant:

static unsigned char *
cd_alloc(struct zip *zip, size_t length)
{
	unsigned char *p;

	if (zip->central_directory == NULL
	    || (zip->central_directory_last->p + length
		> zip->central_directory_last->buff + zip->central_directory_last->buff_size)) {
		struct cd_segment *segment = calloc(1, sizeof(*segment));
		if (segment == NULL)
			return NULL;
		segment->buff_size = 64 * 1024;
		segment->buff = malloc(segment->buff_size);
		if (segment->buff == NULL) {
			free(segment);
			return NULL;
		}
		segment->p = segment->buff;

		if (zip->central_directory == NULL) {
			zip->central_directory
			    = zip->central_directory_last
			    = segment;
		} else {
			zip->central_directory_last->next = segment;
			zip->central_directory_last = segment;
		}
	}

	p = zip->central_directory_last->p;
	zip->central_directory_last->p += length;
	zip->central_directory_bytes += length;
	return (p);
}